

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O2

int __thiscall ncnn::ConvolutionDepthWise::load_model(ConvolutionDepthWise *this,ModelBin *mb)

{
  Mat *pMVar1;
  float fVar2;
  int iVar3;
  float local_74;
  Mat local_70;
  
  if (this->dynamic_weight != 0) {
    return 0;
  }
  (*mb->_vptr_ModelBin[2])(&local_70,mb,(ulong)(uint)this->weight_data_size,0);
  Mat::operator=(&this->weight_data,&local_70);
  Mat::~Mat(&local_70);
  if ((this->weight_data).data == (void *)0x0) {
    return -100;
  }
  if ((long)(this->weight_data).c * (this->weight_data).cstep == 0) {
    return -100;
  }
  if (this->bias_term != 0) {
    (*mb->_vptr_ModelBin[2])(&local_70,mb,(ulong)(uint)this->num_output,1);
    Mat::operator=(&this->bias_data,&local_70);
    Mat::~Mat(&local_70);
    if ((this->bias_data).data == (void *)0x0) {
      return -100;
    }
    if ((long)(this->bias_data).c * (this->bias_data).cstep == 0) {
      return -100;
    }
  }
  iVar3 = this->int8_scale_term;
  if (iVar3 == 1) {
LAB_0024aac1:
    (*mb->_vptr_ModelBin[2])(&local_70,mb,(ulong)(uint)this->group,1);
    Mat::operator=(&this->weight_data_int8_scales,&local_70);
    Mat::~Mat(&local_70);
    (*mb->_vptr_ModelBin[2])(&local_70,mb,1);
    Mat::operator=(&this->bottom_blob_int8_scales,&local_70);
    Mat::~Mat(&local_70);
    local_74 = *(this->bottom_blob_int8_scales).data;
    Mat::Mat(&local_70,this->group,4,(Allocator *)0x0);
    Mat::operator=(&this->bottom_blob_int8_scales,&local_70);
  }
  else {
    if ((iVar3 != 2) && (iVar3 != 0x66)) {
      if (iVar3 != 0x65) goto LAB_0024ac61;
      goto LAB_0024aac1;
    }
    (*mb->_vptr_ModelBin[2])(&local_70,mb,1);
    pMVar1 = &this->weight_data_int8_scales;
    Mat::operator=(pMVar1,&local_70);
    Mat::~Mat(&local_70);
    (*mb->_vptr_ModelBin[2])(&local_70,mb,1);
    Mat::operator=(&this->bottom_blob_int8_scales,&local_70);
    Mat::~Mat(&local_70);
    fVar2 = *(this->weight_data_int8_scales).data;
    Mat::Mat(&local_70,this->group,4,(Allocator *)0x0);
    Mat::operator=(pMVar1,&local_70);
    Mat::~Mat(&local_70);
    Mat::fill(pMVar1,fVar2);
    local_74 = *(this->bottom_blob_int8_scales).data;
    Mat::Mat(&local_70,this->group,4,(Allocator *)0x0);
    Mat::operator=(&this->bottom_blob_int8_scales,&local_70);
  }
  Mat::~Mat(&local_70);
  Mat::fill(&this->bottom_blob_int8_scales,local_74);
  iVar3 = this->int8_scale_term;
LAB_0024ac61:
  if (iVar3 < 0x65) {
    return 0;
  }
  (*mb->_vptr_ModelBin[2])(&local_70,mb,1);
  pMVar1 = &this->top_blob_int8_scales;
  Mat::operator=(pMVar1,&local_70);
  Mat::~Mat(&local_70);
  fVar2 = *(this->top_blob_int8_scales).data;
  Mat::Mat(&local_70,this->group,4,(Allocator *)0x0);
  Mat::operator=(pMVar1,&local_70);
  Mat::~Mat(&local_70);
  Mat::fill(pMVar1,fVar2);
  return 0;
}

Assistant:

int ConvolutionDepthWise::load_model(const ModelBin& mb)
{
    if (dynamic_weight)
        return 0;

    weight_data = mb.load(weight_data_size, 0);
    if (weight_data.empty())
        return -100;

    if (bias_term)
    {
        bias_data = mb.load(num_output, 1);
        if (bias_data.empty())
            return -100;
    }

#if NCNN_INT8
    if (int8_scale_term == 1 || int8_scale_term == 101)
    {
        weight_data_int8_scales = mb.load(group, 1);
        bottom_blob_int8_scales = mb.load(1, 1);

        float bottom_blob_int8_scale = bottom_blob_int8_scales[0];
        bottom_blob_int8_scales = Mat(group);
        bottom_blob_int8_scales.fill(bottom_blob_int8_scale);
    }
    else if (int8_scale_term == 2 || int8_scale_term == 102)
    {
        weight_data_int8_scales = mb.load(1, 1);
        bottom_blob_int8_scales = mb.load(1, 1);

        // extend group if only one provided
        float weight_data_int8_scale = weight_data_int8_scales[0];
        weight_data_int8_scales = Mat(group);
        weight_data_int8_scales.fill(weight_data_int8_scale);

        float bottom_blob_int8_scale = bottom_blob_int8_scales[0];
        bottom_blob_int8_scales = Mat(group);
        bottom_blob_int8_scales.fill(bottom_blob_int8_scale);
    }

    if (int8_scale_term > 100)
    {
        top_blob_int8_scales = mb.load(1, 1);

        float top_blob_int8_scale = top_blob_int8_scales[0];
        top_blob_int8_scales = Mat(group);
        top_blob_int8_scales.fill(top_blob_int8_scale);
    }
#endif // NCNN_INT8

    return 0;
}